

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O1

char * stun_class_name(uint16_t type)

{
  if (0xff < (type & 0x110)) {
    if ((type & 0x110) == 0x110) {
      return "Error Response";
    }
    return "Success Response";
  }
  if ((type & 0x110) == 0) {
    return "Request";
  }
  return "Indication";
}

Assistant:

const char *stun_class_name(uint16_t type)
{
  if (STUN_IS_REQUEST(type))
    return "Request";
  else if (STUN_IS_SUCCESS_RESPONSE(type))
    return "Success Response";
  else if (STUN_IS_ERROR_RESPONSE(type))
    return "Error Response";
  else if (STUN_IS_INDICATION(type))
    return "Indication";
  else
    return "???";
}